

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O2

size_t __thiscall slang::SVInt::hash(SVInt *this)

{
  ulong uVar1;
  bool bVar2;
  SVInt *pSVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  undefined4 *puVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  
  uVar19 = (this->super_SVIntStorage).bitWidth;
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  pSVar3 = (SVInt *)(this->super_SVIntStorage).field_0.val;
  if ((bVar2 & 1U) != 0) {
    this = pSVar3;
  }
  if (0x40 < uVar19) {
    this = pSVar3;
  }
  uVar19 = uVar19 + 0x3f;
  uVar23 = (uVar19 >> 6) << (bVar2 & 0x1fU);
  uVar22 = 0xa0761d6478bd642f;
  uVar1 = (ulong)uVar23 * 8;
  if (uVar23 < 3) {
    if (uVar19 < 0x40) {
      uVar24 = 0;
      uVar21 = 0;
    }
    else {
      uVar24 = CONCAT44(*(undefined4 *)&(this->super_SVIntStorage).field_0,
                        *(undefined4 *)((long)&(this->super_SVIntStorage).field_0 + (uVar1 >> 1)));
      puVar20 = (undefined4 *)((long)this + (uVar1 - 4));
      uVar21 = CONCAT44(*puVar20,*(undefined4 *)((long)puVar20 - (uVar1 >> 1)));
    }
  }
  else {
    uVar21 = uVar1;
    if (6 < uVar23) {
      uVar24 = 0xa0761d6478bd642f;
      uVar25 = 0xa0761d6478bd642f;
      do {
        uVar4._0_4_ = (this->super_SVIntStorage).bitWidth;
        uVar4._4_1_ = (this->super_SVIntStorage).signFlag;
        uVar4._5_1_ = (this->super_SVIntStorage).unknownFlag;
        uVar4._6_2_ = *(undefined2 *)&(this->super_SVIntStorage).field_0xe;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar22 ^ uVar4;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = (this->super_SVIntStorage).field_0.val ^ 0xe7037ed1a0b428db;
        uVar22 = SUB168(auVar9 * auVar15,8) ^ SUB168(auVar9 * auVar15,0);
        uVar5._0_4_ = this[1].super_SVIntStorage.bitWidth;
        uVar5._4_1_ = this[1].super_SVIntStorage.signFlag;
        uVar5._5_1_ = this[1].super_SVIntStorage.unknownFlag;
        uVar5._6_2_ = *(undefined2 *)&this[1].super_SVIntStorage.field_0xe;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar24 ^ uVar5;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = this[1].super_SVIntStorage.field_0.val ^ 0x8ebc6af09c88c6e3;
        uVar24 = SUB168(auVar10 * auVar16,8) ^ SUB168(auVar10 * auVar16,0);
        uVar6._0_4_ = this[2].super_SVIntStorage.bitWidth;
        uVar6._4_1_ = this[2].super_SVIntStorage.signFlag;
        uVar6._5_1_ = this[2].super_SVIntStorage.unknownFlag;
        uVar6._6_2_ = *(undefined2 *)&this[2].super_SVIntStorage.field_0xe;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar25 ^ uVar6;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = this[2].super_SVIntStorage.field_0.val ^ 0x589965cc75374cc3;
        uVar25 = SUB168(auVar11 * auVar17,8) ^ SUB168(auVar11 * auVar17,0);
        this = this + 3;
        uVar21 = uVar21 - 0x30;
      } while (0x30 < uVar21);
      uVar22 = uVar24 ^ uVar22 ^ uVar25;
    }
    for (; 0x10 < uVar21; uVar21 = uVar21 - 0x10) {
      uVar24._0_4_ = (this->super_SVIntStorage).bitWidth;
      uVar24._4_1_ = (this->super_SVIntStorage).signFlag;
      uVar24._5_1_ = (this->super_SVIntStorage).unknownFlag;
      uVar24._6_2_ = *(undefined2 *)&(this->super_SVIntStorage).field_0xe;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar22 ^ uVar24;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (this->super_SVIntStorage).field_0.val ^ 0xe7037ed1a0b428db;
      uVar22 = SUB168(auVar12 * auVar18,8) ^ SUB168(auVar12 * auVar18,0);
      this = this + 1;
    }
    uVar24 = *(ulong *)((long)&this[-1].super_SVIntStorage.field_0 + uVar21);
    uVar21 = *(ulong *)((long)this + (uVar21 - 8));
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar22 ^ uVar21;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar24 ^ 0xe7037ed1a0b428db;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar7 * auVar13,0) ^ SUB168(auVar7 * auVar13,8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1 ^ 0xe7037ed1a0b428db;
  return SUB168(auVar8 * auVar14,0) ^ SUB168(auVar8 * auVar14,8);
}

Assistant:

bool isSingleWord() const { return bitWidth <= BITS_PER_WORD && !unknownFlag; }